

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHTML.c
# Opt level: O3

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  long lVar1;
  xmlChar **ppxVar2;
  size_t sVar3;
  long lVar4;
  uchar *att;
  xmlChar *__s;
  int outlen;
  uchar output [40];
  int local_68;
  int local_64;
  xmlChar **local_60;
  char local_58 [40];
  
  fprintf(_stdout,"SAX.startElement(%s",name);
  if ((atts != (xmlChar **)0x0) && (*atts != (xmlChar *)0x0)) {
    lVar4 = 0;
    local_60 = atts;
    do {
      ppxVar2 = local_60;
      fprintf(_stdout,", %s");
      __s = ppxVar2[lVar4 + 1];
      if (__s != (xmlChar *)0x0) {
        fwrite("=\'",2,1,_stdout);
        while( true ) {
          sVar3 = strlen((char *)__s);
          local_68 = (int)sVar3;
          if (local_68 < 1) break;
          local_64 = 0x27;
          htmlEncodeEntities(local_58,&local_64,__s,&local_68,0x27);
          local_58[local_64] = '\0';
          fputs(local_58,_stdout);
          __s = __s + local_68;
        }
        fputc(0x27,_stdout);
      }
      lVar1 = lVar4 + 2;
      lVar4 = lVar4 + 2;
    } while (local_60[lVar1] != (xmlChar *)0x0);
  }
  fwrite(")\n",2,1,_stdout);
  return;
}

Assistant:

static void
startElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    fprintf(stdout, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(stdout, ", %s", atts[i++]);
	    if (atts[i] != NULL) {
		unsigned char output[40];
		const unsigned char *att = atts[i];
		int outlen, attlen;
	        fprintf(stdout, "='");
		while ((attlen = strlen((char*)att)) > 0) {
		    outlen = sizeof output - 1;
		    htmlEncodeEntities(output, &outlen, att, &attlen, '\'');
		    output[outlen] = 0;
		    fprintf(stdout, "%s", (char *) output);
		    att += attlen;
		}
		fprintf(stdout, "'");
	    }
	}
    }
    fprintf(stdout, ")\n");
}